

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsPrivateDeleteProperty(JsValueRef object,JsValueRef key,JsValueRef *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  BOOL BVar5;
  JsrtContext *currentContext;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  DynamicObject *this;
  JavascriptBoolean *pJVar8;
  ScriptContext *__localScriptContext;
  anon_union_8_2_815e7e51_for_DynamicObject_2 instance;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_60 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  currentContext = JsrtContext::GetCurrent();
  JVar4 = CheckContext(currentContext,false,false);
  if (JVar4 != JsNoError) {
    return JVar4;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_98 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_60,scriptContext,(ScriptEntryExitRecord *)auStack_98,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_60);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                       ,0x335,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_003c9ded;
    *puVar6 = 0;
  }
  JVar4 = JsErrorInvalidArgument;
  if (object != (JsValueRef)0x0) {
    BVar5 = Js::JavascriptOperators::IsObject(object);
    if (BVar5 == 0) {
      JVar4 = JsErrorArgumentNotObject;
    }
    else {
      pRVar7 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003c9b05;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
      }
      JVar4 = JsErrorInvalidArgument;
      if (key != (JsValueRef)0x0) {
        if ((ulong)key >> 0x30 == 0) {
          pRVar7 = Js::VarTo<Js::RecyclableObject>(key);
          pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr;
          if (pSVar1 != scriptContext) {
            JVar4 = JsErrorWrongRuntime;
            if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003c9b05;
            key = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
          }
        }
        this = Js::VarTo<Js::DynamicObject>(object);
        bVar3 = Js::DynamicObject::HasObjectArray(this);
        if (bVar3) {
          bVar3 = Js::DynamicObject::HasObjectArray(this);
          instance = (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0;
          if (bVar3) {
            instance = this->field_1;
          }
          pJVar8 = (JavascriptBoolean *)
                   Js::JavascriptOperators::OP_DeleteElementI
                             ((Var)instance,key,scriptContext,PropertyOperation_None);
        }
        else {
          pJVar8 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).booleanFalse.ptr;
        }
        *result = pJVar8;
        JVar4 = JsNoError;
      }
    }
  }
LAB_003c9b05:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_60);
  if (((JVar4 - JsErrorNoCurrentContext < 7) &&
      ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar4 == JsErrorFatal)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0xcc,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
LAB_003c9ded:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  return JVar4;
}

Assistant:

CHAKRA_API JsPrivateDeleteProperty(
    _In_ JsValueRef object,
    _In_ JsValueRef key,
    _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(key, scriptContext);

        Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(object);
        if (!dynObj->HasObjectArray())
        {
            *result = scriptContext->GetLibrary()->GetFalse();
            return JsNoError;
        }
        *result = Js::JavascriptOperators::OP_DeleteElementI(dynObj->GetObjectArray(), key, scriptContext);

        return JsNoError;
    });
}